

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureVectorizer.pb.cc
# Opt level: O0

size_t __thiscall
CoreML::Specification::FeatureVectorizer_InputColumn::ByteSizeLong
          (FeatureVectorizer_InputColumn *this)

{
  int iVar1;
  long lVar2;
  string *value;
  uint64 uVar3;
  size_t sVar4;
  size_t sStack_18;
  int cached_size;
  size_t total_size;
  FeatureVectorizer_InputColumn *this_local;
  
  sStack_18 = 0;
  inputcolumn_abi_cxx11_(this);
  lVar2 = std::__cxx11::string::size();
  if (lVar2 != 0) {
    value = inputcolumn_abi_cxx11_(this);
    sStack_18 = google::protobuf::internal::WireFormatLite::StringSize(value);
    sStack_18 = sStack_18 + 1;
  }
  uVar3 = inputdimensions(this);
  if (uVar3 != 0) {
    uVar3 = inputdimensions(this);
    sVar4 = google::protobuf::internal::WireFormatLite::UInt64Size(uVar3);
    sStack_18 = sVar4 + 1 + sStack_18;
  }
  iVar1 = google::protobuf::internal::ToCachedSize(sStack_18);
  this->_cached_size_ = iVar1;
  return sStack_18;
}

Assistant:

size_t FeatureVectorizer_InputColumn::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.FeatureVectorizer.InputColumn)
  size_t total_size = 0;

  // string inputColumn = 1;
  if (this->inputcolumn().size() > 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::StringSize(
        this->inputcolumn());
  }

  // uint64 inputDimensions = 2;
  if (this->inputdimensions() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::UInt64Size(
        this->inputdimensions());
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}